

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O2

void __thiscall
gl3cts::TextureSwizzle::SmokeTest::prepareSourceTexture
          (SmokeTest *this,size_t format_idx,size_t target_idx,GLint *out_sizes)

{
  undefined4 uVar1;
  undefined4 uVar2;
  GLint *pGVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  TestError *this_00;
  char *msg;
  int iVar7;
  long lVar8;
  int iVar9;
  GLsizei samples;
  int local_4c;
  long local_48;
  size_t local_40;
  GLint *local_38;
  long lVar6;
  
  iVar7 = *(int *)(texture_targets + target_idx * 0x30 + 0x28);
  local_48 = format_idx * 0x78;
  iVar9 = (&DAT_01e7a2c4)[format_idx * 0x1e];
  uVar1 = *(undefined4 *)(&DAT_01e7a2c8 + local_48);
  samples = 1;
  uVar2 = *(undefined4 *)(&DAT_01e7a2cc + local_48);
  local_40 = target_idx;
  local_38 = out_sizes;
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  (**(code **)(lVar6 + 0x868))(0x8d57,&samples);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xd91);
  (**(code **)(lVar6 + 0x6f8))(1,&this->m_source_tex_id);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"GenTextures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xd95);
  (**(code **)(lVar6 + 0xb8))(iVar7,this->m_source_tex_id);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xd98);
  if (iVar7 == 0xde0) {
    (**(code **)(lVar6 + 0x1308))(0xde0,0,iVar9,1,0,uVar1,uVar2,0);
    msg = "TexImage1D";
    iVar4 = 0xde0;
  }
  else {
    iVar4 = iVar7;
    if (iVar7 == 0xde1) {
LAB_00927403:
      (**(code **)(lVar6 + 0x1310))(iVar7,0,iVar9,1,1,0,uVar1,uVar2,0);
      msg = "TexImage2D";
    }
    else if (iVar7 == 0x806f) {
LAB_00927438:
      (**(code **)(lVar6 + 0x1320))(iVar7,0,iVar9,1,1,1,0,uVar1,uVar2,0);
      msg = "TexImage3D";
    }
    else {
      if (iVar7 == 0x84f5) goto LAB_00927403;
      if (iVar7 == 0x9102) {
        (**(code **)(lVar6 + 0x1328))(0x9102,samples,iVar9,1,1,1,0);
        msg = "TexImage3DMultisample";
        iVar4 = 0x9102;
      }
      else {
        if (iVar7 == 0x8c18) goto LAB_00927403;
        if (iVar7 == 0x8c1a) goto LAB_00927438;
        if (iVar7 == 0x9100) {
          (**(code **)(lVar6 + 0x1318))(0x9100,samples,iVar9,1,1,0);
          msg = "TexImage2DMultisample";
          iVar4 = 0x9100;
        }
        else {
          local_4c = iVar7;
          if (iVar7 != 0x8513) {
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,"Invalid enum",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                       ,0xdd4);
            __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          msg = "TexImage2D";
          for (lVar8 = 0; lVar8 != 0x18; lVar8 = lVar8 + 4) {
            (**(code **)(lVar6 + 0x1310))
                      (*(undefined4 *)((long)&cube_map_faces + lVar8),0,iVar9,1,1,0,uVar1,uVar2,0);
          }
          iVar7 = local_4c;
          iVar4 = 0x8516;
        }
      }
    }
  }
  lVar8 = local_48;
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,msg,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xdd9);
  if ((8 < (local_40 & 0xfffffffffffffff)) || ((0x1a0UL >> (local_40 & 0x3f) & 1) == 0)) {
    (**(code **)(lVar6 + 0x1360))(iVar7,0x813c,0);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"TexParameteri",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                    ,0xde0);
    (**(code **)(lVar6 + 0x1360))(iVar7,0x813d,0);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"TexParameteri",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                    ,0xde3);
    (**(code **)(lVar6 + 0x1360))(iVar7,0x2801,0x2600);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"TexParameteri",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                    ,0xde6);
    (**(code **)(lVar6 + 0x1360))(iVar7,0x2800,0x2600);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"TexParameteri",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                    ,0xde9);
  }
  pGVar3 = local_38;
  if (*(int *)(&DAT_01e7a2d0 + lVar8) == 0x1901) {
    (**(code **)(lVar6 + 0x1360))(iVar7,0x90ea,0x1901);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"TexParameteri",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                    ,0xdef);
  }
  if (2 < iVar9 - 0x81a5U) {
    if (iVar9 != 0x8cad) {
      if (iVar9 == 0x8cac) goto LAB_00927634;
      if (iVar9 != 0x88f0) {
        (**(code **)(lVar6 + 0xab0))(iVar4,0,0x805c,pGVar3);
        dVar5 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar5,"GetTexLevelParameteriv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                        ,0xe0a);
        (**(code **)(lVar6 + 0xab0))(iVar4,0,0x805d,pGVar3 + 1);
        dVar5 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar5,"GetTexLevelParameteriv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                        ,0xe0d);
        (**(code **)(lVar6 + 0xab0))(iVar4,0,0x805e,pGVar3 + 2);
        dVar5 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar5,"GetTexLevelParameteriv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                        ,0xe10);
        (**(code **)(lVar6 + 0xab0))(iVar4,0,0x805f,pGVar3 + 3);
        iVar9 = 0xe13;
        goto LAB_0092764d;
      }
    }
    (**(code **)(lVar6 + 0xab0))(iVar4,0,0x88f1,pGVar3 + 1);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"GetTexLevelParameteriv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                    ,0xdf9);
  }
LAB_00927634:
  (**(code **)(lVar6 + 0xab0))(iVar4,0,0x884a,pGVar3);
  iVar9 = 0xe03;
LAB_0092764d:
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"GetTexLevelParameteriv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,iVar9);
  (**(code **)(lVar6 + 0xb8))(iVar7,0);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xe1a);
  return;
}

Assistant:

void SmokeTest::prepareSourceTexture(size_t format_idx, size_t target_idx, glw::GLint out_sizes[4])
{
	static const glw::GLint border = 0;
	static const glw::GLint level  = 0;

	/* */
	const glw::GLenum	  target		  = texture_targets[target_idx].m_target;
	const _texture_format& texture_format = texture_formats[format_idx];

	/* */
	glw::GLenum		   error		   = 0;
	const glw::GLenum  format		   = texture_format.m_format;
	const glw::GLchar* function_name   = "unknown";
	const glw::GLenum  internal_format = texture_format.m_internal_format;
	glw::GLsizei	   samples		   = 1;
	glw::GLenum		   target_get_prm  = target;
	const glw::GLenum  type			   = texture_format.m_type;

	/*  */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get max number of samples */
	gl.getIntegerv(GL_MAX_SAMPLES, &samples);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	/* Generate and bind */
	gl.genTextures(1, &m_source_tex_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenTextures");

	gl.bindTexture(target, m_source_tex_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

	/* Allocate storage */
	switch (target)
	{
	case GL_TEXTURE_1D:

		gl.texImage1D(target, level, internal_format, m_width, border, format, type, 0 /* pixels */);
		error		  = gl.getError();
		function_name = "TexImage1D";

		break;

	case GL_TEXTURE_1D_ARRAY:
	case GL_TEXTURE_2D:
	case GL_TEXTURE_RECTANGLE:
		gl.texImage2D(target, level, internal_format, m_width, m_height, border, format, type, 0 /* pixels */);
		error		  = gl.getError();
		function_name = "TexImage2D";

		break;

	case GL_TEXTURE_2D_ARRAY:
	case GL_TEXTURE_3D:
		gl.texImage3D(target, level, internal_format, m_width, m_height, m_depth, border, format, type, 0 /* pixels */);
		error		  = gl.getError();
		function_name = "TexImage3D";

		break;

	case GL_TEXTURE_CUBE_MAP:
		for (size_t i = 0; i < n_cube_map_faces; ++i)
		{
			gl.texImage2D(cube_map_faces[i], level, internal_format, m_width, m_height, border, format, type,
						  0 /* pixels */);
		}
		error		  = gl.getError();
		function_name = "TexImage2D";

		target_get_prm = cube_map_faces[0];

		break;

	case GL_TEXTURE_2D_MULTISAMPLE:
		gl.texImage2DMultisample(target, samples, internal_format, m_width, m_height,
								 GL_FALSE /* fixedsamplelocation */);
		error		  = gl.getError();
		function_name = "TexImage2DMultisample";

		break;

	case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
		gl.texImage3DMultisample(target, samples, internal_format, m_width, m_height, m_depth,
								 GL_FALSE /* fixedsamplelocation */);
		error		  = gl.getError();
		function_name = "TexImage3DMultisample";

		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	/* Log error */
	GLU_EXPECT_NO_ERROR(error, function_name);

	/* Make texture complete and set ds texture mode */
	if ((GL_TEXTURE_2D_MULTISAMPLE != target) && (GL_TEXTURE_2D_MULTISAMPLE_ARRAY != target) &&
		(GL_TEXTURE_RECTANGLE != target))
	{
		gl.texParameteri(target, GL_TEXTURE_BASE_LEVEL, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexParameteri");

		gl.texParameteri(target, GL_TEXTURE_MAX_LEVEL, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexParameteri");

		gl.texParameteri(target, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexParameteri");

		gl.texParameteri(target, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexParameteri");
	}

	if (texture_format.m_ds_mode == GL_STENCIL_INDEX)
	{
		gl.texParameteri(target, GL_DEPTH_STENCIL_TEXTURE_MODE, texture_format.m_ds_mode);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexParameteri");
	}

	/* Get internal storage sizes */
	switch (internal_format)
	{
	case GL_DEPTH24_STENCIL8:
	case GL_DEPTH32F_STENCIL8:

		gl.getTexLevelParameteriv(target_get_prm, 0 /* level */, GL_TEXTURE_STENCIL_SIZE, out_sizes + 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetTexLevelParameteriv");

	/* Fall through */

	case GL_DEPTH_COMPONENT16:
	case GL_DEPTH_COMPONENT24:
	case GL_DEPTH_COMPONENT32:
	case GL_DEPTH_COMPONENT32F:

		gl.getTexLevelParameteriv(target_get_prm, 0 /* level */, GL_TEXTURE_DEPTH_SIZE, out_sizes + 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetTexLevelParameteriv");

		break;

	default:

		gl.getTexLevelParameteriv(target_get_prm, 0 /* level */, GL_TEXTURE_RED_SIZE, out_sizes + 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetTexLevelParameteriv");

		gl.getTexLevelParameteriv(target_get_prm, 0 /* level */, GL_TEXTURE_GREEN_SIZE, out_sizes + 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetTexLevelParameteriv");

		gl.getTexLevelParameteriv(target_get_prm, 0 /* level */, GL_TEXTURE_BLUE_SIZE, out_sizes + 2);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetTexLevelParameteriv");

		gl.getTexLevelParameteriv(target_get_prm, 0 /* level */, GL_TEXTURE_ALPHA_SIZE, out_sizes + 3);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetTexLevelParameteriv");

		break;
	}

	/* Unbind texture */
	gl.bindTexture(target, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");
}